

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O3

int __thiscall QTreeViewPrivate::itemForKeyEnd(QTreeViewPrivate *this)

{
  bool bVar1;
  int i;
  
  i = (int)(this->viewItems).d.size;
  do {
    i = i + -1;
    bVar1 = isItemHiddenOrDisabled(this,i);
  } while (bVar1);
  if (i == -1) {
    i = (int)(this->viewItems).d.size + -1;
  }
  return i;
}

Assistant:

int QTreeViewPrivate::itemForKeyEnd() const
{
    int index = viewItems.size() - 1;
    while (isItemHiddenOrDisabled(index))
        index--;
    return index == -1 ? viewItems.size() - 1 : index;
}